

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O0

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,VariableNode *node)

{
  bool bVar1;
  char *in_RDI;
  optional<std::reference_wrapper<Symbol>_> symbol;
  string name;
  Node *in_stack_00000148;
  string *in_stack_00000150;
  VariableNode *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  SymbolTable *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __lhs = &local_30;
  VariableNode::getName_abi_cxx11_(in_stack_ffffffffffffff48);
  SymbolTable::lookup(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4)
  ;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::reference_wrapper<Symbol>_> *)0x14d3ad);
  if (!bVar1) {
    std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::operator+(__lhs,in_RDI);
    reportError(in_stack_00000150,in_stack_00000148);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SemanticAnalyser::visit(const VariableNode& node) 
{
  const auto name = node.getName();
  const auto symbol = symbols_.lookup(name);
  if(!symbol)
    reportError("Usage of undeclared symbol " + name + "!", node);
}